

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

ElabSystemTaskSyntax * __thiscall
slang::parsing::Parser::parseElabSystemTask(Parser *this,AttrList attributes)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  ArgumentListSyntax *arguments;
  ElabSystemTaskSyntax *pEVar4;
  char *__s1;
  size_type __rlen;
  string_view sVar5;
  Token name;
  Token semi;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_68;
  
  local_68.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
  sVar5 = Token::valueText((Token *)&local_68);
  __s1 = sVar5._M_str;
  sVar3 = sVar5._M_len;
  if ((sVar3 == 6) &&
     ((iVar2 = bcmp(__s1,"$fatal",6), iVar2 == 0 || (iVar2 = bcmp(__s1,"$error",6), iVar2 == 0)))) {
LAB_002ea284:
    name = ParserBase::consume(&this->super_ParserBase);
    bVar1 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
    if (bVar1) {
      arguments = parseArgumentList(this);
    }
    else {
      arguments = (ArgumentListSyntax *)0x0;
    }
    local_68.super_SyntaxListBase.super_SyntaxNode.kind = 1;
    local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
    local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006dc3a8;
    local_68.super_SyntaxListBase.childCount = attributes._M_extent._M_extent_value._M_extent_value;
    local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
         attributes._M_ptr;
    local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
    _M_extent_value = attributes._M_extent._M_extent_value._M_extent_value;
    semi = ParserBase::expect(&this->super_ParserBase,Semicolon);
    pEVar4 = slang::syntax::SyntaxFactory::elabSystemTask
                       (&this->factory,&local_68,name,arguments,semi);
  }
  else {
    if (sVar3 == 5) {
      iVar2 = bcmp(__s1,"$info",5);
joined_r0x002ea27b:
      if (iVar2 == 0) goto LAB_002ea284;
    }
    else {
      if (sVar3 == 0xe) {
        iVar2 = bcmp(__s1,"$static_assert",0xe);
        goto joined_r0x002ea27b;
      }
      if (sVar3 == 8) {
        iVar2 = bcmp(__s1,"$warning",8);
        goto joined_r0x002ea27b;
      }
    }
    pEVar4 = (ElabSystemTaskSyntax *)0x0;
  }
  return pEVar4;
}

Assistant:

ElabSystemTaskSyntax* Parser::parseElabSystemTask(AttrList attributes) {
    auto name = peek().valueText();
    if (name != "$fatal"sv && name != "$error"sv && name != "$warning"sv && name != "$info"sv &&
        name != "$static_assert"sv) {
        return nullptr;
    }

    auto nameToken = consume();
    ArgumentListSyntax* argList = nullptr;
    if (peek(TokenKind::OpenParenthesis))
        argList = &parseArgumentList();

    return &factory.elabSystemTask(attributes, nameToken, argList, expect(TokenKind::Semicolon));
}